

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::BayesianProbitRegressor_FeatureValueWeight::ByteSizeLong
          (BayesianProbitRegressor_FeatureValueWeight *this)

{
  bool bVar1;
  uint32 uVar2;
  int iVar3;
  size_t sVar4;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  BayesianProbitRegressor_FeatureValueWeight *this_local;
  
  sStack_18 = 0;
  bVar1 = has_featureweight(this);
  if (bVar1) {
    sStack_18 = google::protobuf::internal::WireFormatLite::
                MessageSizeNoVirtual<CoreML::Specification::BayesianProbitRegressor_Gaussian>
                          (this->featureweight_);
    sStack_18 = sStack_18 + 1;
  }
  uVar2 = featurevalue(this);
  if (uVar2 != 0) {
    uVar2 = featurevalue(this);
    sVar4 = google::protobuf::internal::WireFormatLite::UInt32Size(uVar2);
    sStack_18 = sVar4 + 1 + sStack_18;
  }
  iVar3 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar3;
  return sStack_18;
}

Assistant:

size_t BayesianProbitRegressor_FeatureValueWeight::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.BayesianProbitRegressor.FeatureValueWeight)
  size_t total_size = 0;

  // .CoreML.Specification.BayesianProbitRegressor.Gaussian featureWeight = 2;
  if (this->has_featureweight()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->featureweight_);
  }

  // uint32 featureValue = 1;
  if (this->featurevalue() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt32Size(
        this->featurevalue());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}